

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<toml::basic_value<toml::type_config>_*,_toml::error_info> *
toml::detail::insert_value<toml::type_config>
          (result<toml::basic_value<toml::type_config>_*,_toml::error_info> *__return_storage_ptr__,
          inserting_value_kind kind,table_type *current_table_ptr,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keys,region *key_reg,basic_value<toml::type_config> *val)

{
  key_type *k;
  basic_value<toml::type_config> *pbVar1;
  pointer pbVar2;
  bool bVar3;
  const_reference __k;
  table_format_info *ptVar4;
  table_type *ptVar5;
  value_type *pvVar6;
  array_format_info *paVar7;
  vector<toml::basic_value<toml::type_config>,std::allocator<toml::basic_value<toml::type_config>>>
  *this;
  array_type *paVar8;
  iterator iVar9;
  mapped_type *pmVar10;
  ulong __n;
  undefined7 in_register_00000031;
  string *this_00;
  __node_base *p_Var11;
  result<toml::basic_value<toml::type_config>_*,_toml::error_info> *prVar12;
  initializer_list<toml::basic_value<toml::type_config>_> __l;
  table_format_info fmt;
  char (*in_stack_fffffffffffff028) [33];
  allocator<char> local_fc9;
  result<toml::basic_value<toml::type_config>_*,_toml::error_info> *local_fc8;
  allocator<char> local_fb9;
  basic_value<toml::type_config> *local_fb8;
  region *local_fb0;
  ulong local_fa8;
  basic_value<toml::type_config> local_fa0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ed8;
  vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
  local_eb8;
  error_info local_ea0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_e48;
  basic_value<toml::type_config> local_e10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d48;
  string local_d28;
  string local_d08;
  undefined1 local_ce8 [32];
  string local_cc8;
  undefined1 local_ca8 [32];
  string local_c88;
  undefined1 local_c68 [32];
  string local_c48;
  undefined1 local_c28 [32];
  string local_c08;
  undefined1 local_be8 [32];
  string local_bc8;
  undefined1 local_ba8 [32];
  string local_b88;
  undefined1 local_b68 [32];
  string local_b48;
  undefined1 local_b28 [32];
  string local_b08;
  undefined1 local_ae8 [32];
  string local_ac8;
  undefined1 local_aa8 [32];
  string local_a88;
  source_location key_loc;
  region local_9f0;
  source_location local_988;
  source_location local_910;
  source_location local_898;
  source_location local_820;
  source_location local_7a8;
  source_location local_730;
  source_location local_6b8;
  source_location local_640;
  source_location local_5c8;
  source_location local_550;
  source_location local_4d8;
  region local_460;
  error_info local_3f8;
  error_info local_3a0;
  error_info local_348;
  error_info local_2f0;
  error_info local_298;
  error_info local_240;
  error_info local_1e8;
  error_info local_190;
  error_info local_138;
  error_info local_e0;
  error_info local_88;
  
  local_fc8 = __return_storage_ptr__;
  local_fb8 = val;
  local_fb0 = key_reg;
  source_location::source_location(&key_loc,key_reg);
  local_fa8 = (ulong)((int)CONCAT71(in_register_00000031,kind) != 2) * 2 + 0x202;
  __n = 0;
  do {
    while( true ) {
      if ((ulong)((long)(keys->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(keys->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5) <= __n) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d08,"toml::insert_key: no keys found",
                   (allocator<char> *)&local_e10);
        source_location::source_location(&local_988,&key_loc);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d28,"here",(allocator<char> *)&local_ea0);
        make_error_info<>((error_info *)&local_fa0,&local_d08,&local_988,&local_d28);
        err<toml::error_info>((failure<toml::error_info> *)&local_3f8,(error_info *)&local_fa0);
        prVar12 = local_fc8;
        result<toml::basic_value<toml::type_config>_*,_toml::error_info>::result
                  (local_fc8,(failure_type *)&local_3f8);
        error_info::~error_info(&local_3f8);
        error_info::~error_info((error_info *)&local_fa0);
        std::__cxx11::string::~string((string *)&local_d28);
        source_location::~source_location(&local_988);
        this_00 = &local_d08;
        goto LAB_002e390b;
      }
      __k = CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)keys,__n);
      if ((ulong)((long)(keys->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(keys->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5) <= __n + 1) break;
      iVar9 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&current_table_ptr->_M_h,(key_type *)__k);
      if (iVar9.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        local_e48._M_buckets = &local_e48._M_single_bucket;
        local_e48._M_bucket_count = 1;
        local_e48._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_e48._M_element_count = 0;
        local_e48._M_rehash_policy._M_max_load_factor = 1.0;
        local_e48._M_rehash_policy._4_4_ = 0;
        local_e48._M_rehash_policy._M_next_resize = 0;
        local_e48._M_single_bucket = (__node_base_ptr)0x0;
        local_ed8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_ed8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_ed8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        region::region(&local_9f0,local_fb0);
        fmt.name_indent = 0;
        fmt.closing_indent = 0;
        fmt.fmt = (undefined1)local_fa8;
        fmt.indent_type = local_fa8._1_1_;
        fmt._2_2_ = local_fa8._2_2_;
        fmt.body_indent = local_fa8._4_4_;
        basic_value<toml::type_config>::basic_value
                  (&local_fa0,(table_type *)&local_e48,fmt,&local_ed8,&local_9f0);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::__cxx11::string_const&,toml::basic_value<toml::type_config>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)current_table_ptr,__k,&local_fa0);
        basic_value<toml::type_config>::~basic_value(&local_fa0);
        region::~region(&local_9f0);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_ed8);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_e48);
        pmVar10 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        *)current_table_ptr,(key_type *)__k);
        __n = __n + 1;
        current_table_ptr = basic_value<toml::type_config>::as_table_abi_cxx11_(pmVar10);
      }
      else {
        __n = __n + 1;
        pbVar1 = (basic_value<toml::type_config> *)
                 ((long)iVar9.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                        ._M_cur + 0x28);
        if (*(char *)((long)iVar9.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                            ._M_cur + 0x28) == '\n') {
          ptVar4 = basic_value<toml::type_config>::as_table_fmt(pbVar1);
          if ((ptVar4->fmt & ~dotted) == oneline) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)(local_aa8 + 0x20),
                       "toml::insert_value: failed to insert a value: inline table is immutable",
                       (allocator<char> *)&local_ea0);
            source_location::source_location(&local_4d8,&key_loc);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_aa8,"inserting this",&local_fc9);
            source_location::source_location
                      ((source_location *)&local_fa0,
                       (region *)
                       ((long)iVar9.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                              ._M_cur + 0x70));
            make_error_info<toml::source_location,char_const(&)[14]>
                      ((error_info *)&local_e10,(toml *)(local_aa8 + 0x20),(string *)&local_4d8,
                       (source_location *)local_aa8,(string *)&local_fa0,
                       (source_location *)"to this table",(char (*) [14])in_stack_fffffffffffff028);
            err<toml::error_info>((failure<toml::error_info> *)&local_88,(error_info *)&local_e10);
            prVar12 = local_fc8;
            result<toml::basic_value<toml::type_config>_*,_toml::error_info>::result
                      (local_fc8,(failure_type *)&local_88);
            error_info::~error_info(&local_88);
            error_info::~error_info((error_info *)&local_e10);
            source_location::~source_location((source_location *)&local_fa0);
            std::__cxx11::string::~string((string *)local_aa8);
            source_location::~source_location(&local_4d8);
            this_00 = (string *)(local_aa8 + 0x20);
            goto LAB_002e390b;
          }
          if ((kind == dotted_keys) && (ptVar4->fmt != dotted)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)(local_ae8 + 0x20),
                       "toml::insert_value: reopening a table using dotted keys",
                       (allocator<char> *)&local_ea0);
            source_location::source_location(&local_550,&key_loc);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_ae8,"dotted key cannot reopen a table",&local_fc9);
            source_location::source_location
                      ((source_location *)&local_fa0,
                       (region *)
                       ((long)iVar9.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                              ._M_cur + 0x70));
            make_error_info<toml::source_location,char_const(&)[29]>
                      ((error_info *)&local_e10,(toml *)(local_ae8 + 0x20),(string *)&local_550,
                       (source_location *)local_ae8,(string *)&local_fa0,
                       (source_location *)"this table is already closed",
                       (char (*) [29])in_stack_fffffffffffff028);
            err<toml::error_info>((failure<toml::error_info> *)&local_e0,(error_info *)&local_e10);
            prVar12 = local_fc8;
            result<toml::basic_value<toml::type_config>_*,_toml::error_info>::result
                      (local_fc8,(failure_type *)&local_e0);
            error_info::~error_info(&local_e0);
            error_info::~error_info((error_info *)&local_e10);
            source_location::~source_location((source_location *)&local_fa0);
            std::__cxx11::string::~string((string *)local_ae8);
            source_location::~source_location(&local_550);
            this_00 = (string *)(local_ae8 + 0x20);
            goto LAB_002e390b;
          }
          current_table_ptr = basic_value<toml::type_config>::as_table_abi_cxx11_(pbVar1);
        }
        else {
          bVar3 = basic_value<toml::type_config>::is_array_of_tables(pbVar1);
          if (!bVar3) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)(local_ba8 + 0x20),
                       "toml::insert_value: failed to insert a value, value already exists",
                       (allocator<char> *)&local_ea0);
            source_location::source_location(&local_6b8,&key_loc);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_ba8,"while inserting this",&local_fc9);
            source_location::source_location
                      ((source_location *)&local_fa0,
                       (region *)
                       ((long)iVar9.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                              ._M_cur + 0x70));
            make_error_info<toml::source_location,char_const(&)[31]>
                      ((error_info *)&local_e10,(toml *)(local_ba8 + 0x20),(string *)&local_6b8,
                       (source_location *)local_ba8,(string *)&local_fa0,
                       (source_location *)"non-table value already exists",
                       (char (*) [31])in_stack_fffffffffffff028);
            err<toml::error_info>((failure<toml::error_info> *)&local_1e8,(error_info *)&local_e10);
            prVar12 = local_fc8;
            result<toml::basic_value<toml::type_config>_*,_toml::error_info>::result
                      (local_fc8,(failure_type *)&local_1e8);
            error_info::~error_info(&local_1e8);
            error_info::~error_info((error_info *)&local_e10);
            source_location::~source_location((source_location *)&local_fa0);
            std::__cxx11::string::~string((string *)local_ba8);
            source_location::~source_location(&local_6b8);
            this_00 = (string *)(local_ba8 + 0x20);
            goto LAB_002e390b;
          }
          paVar7 = basic_value<toml::type_config>::as_array_fmt(pbVar1);
          if (paVar7->fmt != array_of_tables) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)(local_b28 + 0x20),
                       "toml::insert_value:inline array of tables are immutable",
                       (allocator<char> *)&local_ea0);
            source_location::source_location(&local_5c8,&key_loc);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_b28,"inserting this",&local_fc9);
            source_location::source_location
                      ((source_location *)&local_fa0,
                       (region *)
                       ((long)iVar9.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                              ._M_cur + 0x70));
            make_error_info<toml::source_location,char_const(&)[23]>
                      ((error_info *)&local_e10,(toml *)(local_b28 + 0x20),(string *)&local_5c8,
                       (source_location *)local_b28,(string *)&local_fa0,
                       (source_location *)"inline array of tables",
                       (char (*) [23])in_stack_fffffffffffff028);
            err<toml::error_info>((failure<toml::error_info> *)&local_138,(error_info *)&local_e10);
            prVar12 = local_fc8;
            result<toml::basic_value<toml::type_config>_*,_toml::error_info>::result
                      (local_fc8,(failure_type *)&local_138);
            error_info::~error_info(&local_138);
            error_info::~error_info((error_info *)&local_e10);
            source_location::~source_location((source_location *)&local_fa0);
            std::__cxx11::string::~string((string *)local_b28);
            source_location::~source_location(&local_5c8);
            this_00 = (string *)(local_b28 + 0x20);
            goto LAB_002e390b;
          }
          if (kind == dotted_keys) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)(local_b68 + 0x20),
                       "toml::insert_value:dotted key cannot reopen an array-of-tables",
                       (allocator<char> *)&local_ea0);
            source_location::source_location(&local_640,&key_loc);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_b68,"inserting this",&local_fc9);
            source_location::source_location
                      ((source_location *)&local_fa0,
                       (region *)
                       ((long)iVar9.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                              ._M_cur + 0x70));
            make_error_info<toml::source_location,char_const(&)[25]>
                      ((error_info *)&local_e10,(toml *)(local_b68 + 0x20),(string *)&local_640,
                       (source_location *)local_b68,(string *)&local_fa0,
                       (source_location *)"to this array-of-tables.",
                       (char (*) [25])in_stack_fffffffffffff028);
            err<toml::error_info>((failure<toml::error_info> *)&local_190,(error_info *)&local_e10);
            prVar12 = local_fc8;
            result<toml::basic_value<toml::type_config>_*,_toml::error_info>::result
                      (local_fc8,(failure_type *)&local_190);
            error_info::~error_info(&local_190);
            error_info::~error_info((error_info *)&local_e10);
            source_location::~source_location((source_location *)&local_fa0);
            std::__cxx11::string::~string((string *)local_b68);
            source_location::~source_location(&local_640);
            this_00 = (string *)(local_b68 + 0x20);
            goto LAB_002e390b;
          }
          paVar8 = basic_value<toml::type_config>::as_array(pbVar1);
          current_table_ptr =
               basic_value<toml::type_config>::as_table_abi_cxx11_
                         ((paVar8->
                          super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish + -1);
        }
      }
    }
    if (kind == std_table) {
      iVar9 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&current_table_ptr->_M_h,(key_type *)__k);
      if (iVar9.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::__cxx11::string_const&,toml::basic_value<toml::type_config>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)current_table_ptr,__k,local_fb8);
        pmVar10 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        *)current_table_ptr,(key_type *)__k);
        goto LAB_002e35af;
      }
      if (*(char *)((long)iVar9.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                          ._M_cur + 0x28) == '\n') {
        pbVar1 = (basic_value<toml::type_config> *)
                 ((long)iVar9.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                        ._M_cur + 0x28);
        ptVar4 = basic_value<toml::type_config>::as_table_fmt(pbVar1);
        if (ptVar4->fmt == implicit) {
          ptVar5 = basic_value<toml::type_config>::as_table_abi_cxx11_(local_fb8);
          p_Var11 = &(ptVar5->_M_h)._M_before_begin;
          goto LAB_002e31c3;
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_c28 + 0x20),
                 "toml::insert_value: failed to insert a table, table already defined",
                 (allocator<char> *)&local_ea0);
      source_location::source_location(&local_7a8,&key_loc);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_c28,"inserting this",&local_fc9);
      source_location::source_location
                ((source_location *)&local_fa0,
                 (region *)
                 ((long)iVar9.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                        ._M_cur + 0x70));
      make_error_info<toml::source_location,char_const(&)[33]>
                ((error_info *)&local_e10,(toml *)(local_c28 + 0x20),(string *)&local_7a8,
                 (source_location *)local_c28,(string *)&local_fa0,
                 (source_location *)"this table is explicitly defined",in_stack_fffffffffffff028);
      err<toml::error_info>((failure<toml::error_info> *)&local_298,(error_info *)&local_e10);
      prVar12 = local_fc8;
      result<toml::basic_value<toml::type_config>_*,_toml::error_info>::result
                (local_fc8,(failure_type *)&local_298);
      error_info::~error_info(&local_298);
      error_info::~error_info((error_info *)&local_e10);
      source_location::~source_location((source_location *)&local_fa0);
      std::__cxx11::string::~string((string *)local_c28);
      source_location::~source_location(&local_7a8);
      this_00 = (string *)(local_c28 + 0x20);
      goto LAB_002e390b;
    }
    if (kind == array_table) {
      iVar9 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&current_table_ptr->_M_h,(key_type *)__k);
      if (iVar9.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        basic_value<toml::type_config>::basic_value(&local_e10,local_fb8);
        __l._M_len = 1;
        __l._M_array = &local_e10;
        std::
        vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ::vector(&local_eb8,__l,(allocator_type *)&local_ea0);
        local_d48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_d48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_d48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        region::region(&local_460,local_fb0);
        basic_value<toml::type_config>::basic_value
                  (&local_fa0,&local_eb8,(array_format_info)ZEXT812(0x400000203),&local_d48,
                   &local_460);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::__cxx11::string_const&,toml::basic_value<toml::type_config>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)current_table_ptr,__k,&local_fa0);
        basic_value<toml::type_config>::~basic_value(&local_fa0);
        region::~region(&local_460);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_d48);
        std::
        vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ::~vector(&local_eb8);
        basic_value<toml::type_config>::~basic_value(&local_e10);
        pmVar10 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        *)current_table_ptr,(key_type *)__k);
        paVar8 = basic_value<toml::type_config>::as_array(pmVar10);
      }
      else {
        pbVar1 = (basic_value<toml::type_config> *)
                 ((long)iVar9.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                        ._M_cur + 0x28);
        bVar3 = basic_value<toml::type_config>::is_array_of_tables(pbVar1);
        if (!bVar3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)(local_ca8 + 0x20),
                     "toml::insert_value: failed to insert an array of tables, value already exists"
                     ,(allocator<char> *)&local_ea0);
          source_location::source_location(&local_898,&key_loc);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_ca8,"while inserting this",&local_fc9);
          source_location::source_location
                    ((source_location *)&local_fa0,
                     (region *)
                     ((long)iVar9.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                            ._M_cur + 0x70));
          make_error_info<toml::source_location,char_const(&)[31]>
                    ((error_info *)&local_e10,(toml *)(local_ca8 + 0x20),(string *)&local_898,
                     (source_location *)local_ca8,(string *)&local_fa0,
                     (source_location *)"non-table value already exists",
                     (char (*) [31])in_stack_fffffffffffff028);
          err<toml::error_info>((failure<toml::error_info> *)&local_348,(error_info *)&local_e10);
          prVar12 = local_fc8;
          result<toml::basic_value<toml::type_config>_*,_toml::error_info>::result
                    (local_fc8,(failure_type *)&local_348);
          error_info::~error_info(&local_348);
          error_info::~error_info((error_info *)&local_e10);
          source_location::~source_location((source_location *)&local_fa0);
          std::__cxx11::string::~string((string *)local_ca8);
          source_location::~source_location(&local_898);
          this_00 = (string *)(local_ca8 + 0x20);
          goto LAB_002e390b;
        }
        paVar7 = basic_value<toml::type_config>::as_array_fmt(pbVar1);
        if (paVar7->fmt != array_of_tables) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)(local_ce8 + 0x20),
                     "toml::insert_value: failed to insert a table, inline array of tables is immutable"
                     ,(allocator<char> *)&local_ea0);
          source_location::source_location(&local_910,&key_loc);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_ce8,"while inserting this",&local_fc9);
          source_location::source_location
                    ((source_location *)&local_fa0,
                     (region *)
                     ((long)iVar9.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                            ._M_cur + 0x70));
          make_error_info<toml::source_location,char_const(&)[31]>
                    ((error_info *)&local_e10,(toml *)(local_ce8 + 0x20),(string *)&local_910,
                     (source_location *)local_ce8,(string *)&local_fa0,
                     (source_location *)"this is inline array-of-tables",
                     (char (*) [31])in_stack_fffffffffffff028);
          err<toml::error_info>((failure<toml::error_info> *)&local_3a0,(error_info *)&local_e10);
          prVar12 = local_fc8;
          result<toml::basic_value<toml::type_config>_*,_toml::error_info>::result
                    (local_fc8,(failure_type *)&local_3a0);
          error_info::~error_info(&local_3a0);
          error_info::~error_info((error_info *)&local_e10);
          source_location::~source_location((source_location *)&local_fa0);
          std::__cxx11::string::~string((string *)local_ce8);
          source_location::~source_location(&local_910);
          this_00 = (string *)(local_ce8 + 0x20);
          goto LAB_002e390b;
        }
        this = (vector<toml::basic_value<toml::type_config>,std::allocator<toml::basic_value<toml::type_config>>>
                *)basic_value<toml::type_config>::as_array(pbVar1);
        std::
        vector<toml::basic_value<toml::type_config>,std::allocator<toml::basic_value<toml::type_config>>>
        ::emplace_back<toml::basic_value<toml::type_config>>(this,local_fb8);
        pmVar10 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        *)current_table_ptr,(key_type *)__k);
        paVar8 = basic_value<toml::type_config>::as_array(pmVar10);
      }
      pbVar2 = (paVar8->
               super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      local_fc8->is_ok_ = true;
      (local_fc8->field_1).succ_.value = pbVar2 + -1;
      prVar12 = local_fc8;
      goto LAB_002e3910;
    }
    __n = __n + 1;
  } while (kind != dotted_keys);
  iVar9 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&current_table_ptr->_M_h,(key_type *)__k);
  if (iVar9.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_be8 + 0x20),
               "toml::insert_value: failed to insert a value, value already exists",
               (allocator<char> *)&local_ea0);
    source_location::source_location(&local_730,&key_loc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_be8,"inserting this",&local_fc9);
    pmVar10 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    *)current_table_ptr,(key_type *)__k);
    source_location::source_location((source_location *)&local_fa0,&pmVar10->region_);
    make_error_info<toml::source_location,char_const(&)[25]>
              ((error_info *)&local_e10,(toml *)(local_be8 + 0x20),(string *)&local_730,
               (source_location *)local_be8,(string *)&local_fa0,
               (source_location *)"but value already exists",
               (char (*) [25])in_stack_fffffffffffff028);
    err<toml::error_info>((failure<toml::error_info> *)&local_240,(error_info *)&local_e10);
    prVar12 = local_fc8;
    result<toml::basic_value<toml::type_config>_*,_toml::error_info>::result
              (local_fc8,(failure_type *)&local_240);
    error_info::~error_info(&local_240);
    error_info::~error_info((error_info *)&local_e10);
    source_location::~source_location((source_location *)&local_fa0);
    std::__cxx11::string::~string((string *)local_be8);
    source_location::~source_location(&local_730);
    this_00 = (string *)(local_be8 + 0x20);
LAB_002e390b:
    std::__cxx11::string::~string((string *)this_00);
    goto LAB_002e3910;
  }
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::__cxx11::string_const&,toml::basic_value<toml::type_config>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)current_table_ptr,__k,local_fb8);
  pmVar10 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)current_table_ptr,(key_type *)__k);
LAB_002e35af:
  local_fc8->is_ok_ = true;
  (local_fc8->field_1).succ_.value = pmVar10;
  prVar12 = local_fc8;
LAB_002e3910:
  source_location::~source_location(&key_loc);
  return prVar12;
LAB_002e31c3:
  p_Var11 = p_Var11->_M_nxt;
  if (p_Var11 == (__node_base *)0x0) goto LAB_002e37b1;
  k = (key_type *)(p_Var11 + 1);
  bVar3 = basic_value<toml::type_config>::contains(pbVar1,k);
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_c68 + 0x20),
               "toml::insert_value: failed to insert a table, table keys conflict to each other",
               &local_fc9);
    source_location::source_location(&local_820,&key_loc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c68,"inserting this table",&local_fb9);
    source_location::source_location((source_location *)&local_fa0,(region *)(p_Var11 + 0xe));
    pvVar6 = basic_value<toml::type_config>::at(pbVar1,k);
    source_location::source_location((source_location *)&local_e10,&pvVar6->region_);
    make_error_info<toml::source_location,char_const(&)[18],toml::source_location,char_const(&)[21]>
              (&local_ea0,(toml *)(local_c68 + 0x20),(string *)&local_820,
               (source_location *)local_c68,(string *)&local_fa0,
               (source_location *)"having this value",(char (*) [18])&local_e10,
               (source_location *)"already defined here",(char (*) [21])in_stack_fffffffffffff028);
    err<toml::error_info>((failure<toml::error_info> *)&local_2f0,&local_ea0);
    prVar12 = local_fc8;
    result<toml::basic_value<toml::type_config>_*,_toml::error_info>::result
              (local_fc8,(failure_type *)&local_2f0);
    error_info::~error_info(&local_2f0);
    error_info::~error_info(&local_ea0);
    source_location::~source_location((source_location *)&local_e10);
    source_location::~source_location((source_location *)&local_fa0);
    std::__cxx11::string::~string((string *)local_c68);
    source_location::~source_location(&local_820);
    this_00 = (string *)(local_c68 + 0x20);
    goto LAB_002e390b;
  }
  pvVar6 = basic_value<toml::type_config>::operator[](pbVar1,k);
  basic_value<toml::type_config>::operator=(pvVar6,(basic_value<toml::type_config> *)(p_Var11 + 5));
  goto LAB_002e31c3;
LAB_002e37b1:
  ptVar4 = basic_value<toml::type_config>::as_table_fmt(pbVar1);
  ptVar4->fmt = multiline;
  region::operator=((region *)
                    ((long)iVar9.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                           ._M_cur + 0x70),&local_fb8->region_);
  pmVar10 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)current_table_ptr,(key_type *)__k);
  goto LAB_002e35af;
}

Assistant:

result<basic_value<TC>*, error_info>
insert_value(const inserting_value_kind kind,
    typename basic_value<TC>::table_type* current_table_ptr,
    const std::vector<typename basic_value<TC>::key_type>& keys, region key_reg,
    basic_value<TC> val)
{
    using value_type = basic_value<TC>;
    using array_type = typename basic_value<TC>::array_type;
    using table_type = typename basic_value<TC>::table_type;

    auto key_loc = source_location(key_reg);

    assert( ! keys.empty());

    // dotted key can insert to dotted key tables defined at the same level.
    // dotted key can NOT reopen a table even if it is implcitly-defined one.
    //
    // [x.y.z] # define x and x.y implicitly.
    // a = 42
    //
    // [x] # reopening implcitly defined table
    // r.s.t = 3.14 # VALID r and r.s are new tables.
    // r.s.u = 2.71 # VALID r and r.s are dotted-key tables. valid.
    //
    // y.z.b = "foo" # INVALID x.y.z are multiline table, not a dotted key.
    // y.c   = "bar" # INVALID x.y is implicit multiline table, not a dotted key.

    // a table cannot reopen dotted-key tables.
    //
    // [t1]
    // t2.t3.v = 0
    // [t1.t2] # INVALID t1.t2 is defined as a dotted-key table.

    for(std::size_t i=0; i<keys.size(); ++i)
    {
        const auto& key = keys.at(i);
        table_type& current_table = *current_table_ptr;

        if(i+1 < keys.size()) // there are more keys. go down recursively...
        {
            const auto found = current_table.find(key);
            if(found == current_table.end()) // not found. add new table
            {
                table_format_info fmt;
                fmt.indent_type = indent_char::none;
                if(kind == inserting_value_kind::dotted_keys)
                {
                    fmt.fmt = table_format::dotted;
                }
                else // table / array of tables
                {
                    fmt.fmt = table_format::implicit;
                }
                current_table.emplace(key, value_type(
                    table_type{}, fmt, std::vector<std::string>{}, key_reg));

                assert(current_table.at(key).is_table());
                current_table_ptr = std::addressof(current_table.at(key).as_table());
            }
            else if (found->second.is_table())
            {
                const auto fmt = found->second.as_table_fmt().fmt;
                if(fmt == table_format::oneline || fmt == table_format::multiline_oneline)
                {
                    // foo = {bar = "baz"} or foo = { \n bar = "baz" \n }
                    return err(make_error_info("toml::insert_value: "
                        "failed to insert a value: inline table is immutable",
                        key_loc, "inserting this",
                        found->second.location(), "to this table"));
                }
                // dotted key cannot reopen a table.
                if(kind ==inserting_value_kind::dotted_keys && fmt != table_format::dotted)
                {
                    return err(make_error_info("toml::insert_value: "
                        "reopening a table using dotted keys",
                        key_loc, "dotted key cannot reopen a table",
                        found->second.location(), "this table is already closed"));
                }
                assert(found->second.is_table());
                current_table_ptr = std::addressof(found->second.as_table());
            }
            else if(found->second.is_array_of_tables())
            {
                // aot = [{this = "type", of = "aot"}] # cannot be reopened
                if(found->second.as_array_fmt().fmt != array_format::array_of_tables)
                {
                    return err(make_error_info("toml::insert_value:"
                        "inline array of tables are immutable",
                        key_loc, "inserting this",
                        found->second.location(), "inline array of tables"));
                }
                // appending to [[aot]]

                if(kind == inserting_value_kind::dotted_keys)
                {
                    // [[array.of.tables]]
                    // [array.of]          # reopening supertable is okay
                    // tables.x = "foo"    # appending `x` to the first table
                    return err(make_error_info("toml::insert_value:"
                        "dotted key cannot reopen an array-of-tables",
                        key_loc, "inserting this",
                        found->second.location(), "to this array-of-tables."));
                }

                // insert_value_by_dotkeys::std_table
                // [[array.of.tables]]
                // [array.of.tables.subtable] # appending to the last aot
                //
                // insert_value_by_dotkeys::array_table
                // [[array.of.tables]]
                // [[array.of.tables.subtable]] # appending to the last aot
                auto& current_array_table = found->second.as_array().back();

                assert(current_array_table.is_table());
                current_table_ptr = std::addressof(current_array_table.as_table());
            }
            else
            {
                return err(make_error_info("toml::insert_value: "
                    "failed to insert a value, value already exists",
                    key_loc, "while inserting this",
                    found->second.location(), "non-table value already exists"));
            }
        }
        else // this is the last key. insert a new value.
        {
            switch(kind)
            {
                case inserting_value_kind::dotted_keys:
                {
                    if(current_table.find(key) != current_table.end())
                    {
                        return err(make_error_info("toml::insert_value: "
                            "failed to insert a value, value already exists",
                            key_loc, "inserting this",
                            current_table.at(key).location(), "but value already exists"));
                    }
                    current_table.emplace(key, std::move(val));
                    return ok(std::addressof(current_table.at(key)));
                }
                case inserting_value_kind::std_table:
                {
                    // defining a new table or reopening supertable
                    auto found = current_table.find(key);
                    if(found == current_table.end()) // define a new aot
                    {
                        current_table.emplace(key, std::move(val));
                        return ok(std::addressof(current_table.at(key)));
                    }
                    else // the table is already defined, reopen it
                    {
                        // assigning a [std.table]. it must be an implicit table.
                        auto& target = found->second;
                        if( ! target.is_table() || // could be an array-of-tables
                            target.as_table_fmt().fmt != table_format::implicit)
                        {
                            return err(make_error_info("toml::insert_value: "
                                "failed to insert a table, table already defined",
                                key_loc, "inserting this",
                                target.location(), "this table is explicitly defined"));
                        }

                        // merge table
                        for(const auto& kv : val.as_table())
                        {
                            if(target.contains(kv.first))
                            {
                                // [x.y.z]
                                // w = "foo"
                                // [x]
                                // y = "bar"
                                return err(make_error_info("toml::insert_value: "
                                    "failed to insert a table, table keys conflict to each other",
                                    key_loc, "inserting this table",
                                    kv.second.location(), "having this value",
                                    target.at(kv.first).location(), "already defined here"));
                            }
                            else
                            {
                                target[kv.first] = kv.second;
                            }
                        }
                        // change implicit -> explicit
                        target.as_table_fmt().fmt = table_format::multiline;
                        // change definition region
                        change_region_of_value(target, val);

                        return ok(std::addressof(current_table.at(key)));
                    }
                }
                case inserting_value_kind::array_table:
                {
                    auto found = current_table.find(key);
                    if(found == current_table.end()) // define a new aot
                    {
                        array_format_info fmt;
                        fmt.fmt = array_format::array_of_tables;
                        fmt.indent_type = indent_char::none;

                        current_table.emplace(key, value_type(
                                array_type{ std::move(val) }, std::move(fmt),
                                std::vector<std::string>{}, std::move(key_reg)
                            ));

                        assert( ! current_table.at(key).as_array().empty());
                        return ok(std::addressof(current_table.at(key).as_array().back()));
                    }
                    else // the array is already defined, append to it
                    {
                        if( ! found->second.is_array_of_tables())
                        {
                            return err(make_error_info("toml::insert_value: "
                                "failed to insert an array of tables, value already exists",
                                key_loc, "while inserting this",
                                found->second.location(), "non-table value already exists"));
                        }
                        if(found->second.as_array_fmt().fmt != array_format::array_of_tables)
                        {
                            return err(make_error_info("toml::insert_value: "
                                "failed to insert a table, inline array of tables is immutable",
                                key_loc, "while inserting this",
                                found->second.location(), "this is inline array-of-tables"));
                        }
                        found->second.as_array().push_back(std::move(val));
                        assert( ! current_table.at(key).as_array().empty());
                        return ok(std::addressof(current_table.at(key).as_array().back()));
                    }
                }
                default: {assert(false);}
            }
        }
    }
    return err(make_error_info("toml::insert_key: no keys found",
                std::move(key_loc), "here"));
}